

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void check_redraw_corresponding_parent(Fl_Type *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar2;
  Fl_Type *local_20;
  Fl_Type *i;
  Fl_Widget_Type *prev_parent;
  Fl_Type *s_local;
  
  i = (Fl_Type *)0x0;
  if (((s == (Fl_Type *)0x0) || (s->selected == '\0')) ||
     (iVar1 = (*s->_vptr_Fl_Type[0x17])(), local_20 = s, iVar1 == 0)) {
    return;
  }
  do {
    bVar2 = false;
    if (local_20 != (Fl_Type *)0x0) {
      bVar2 = local_20->parent != (Fl_Type *)0x0;
    }
    if (!bVar2) {
      return;
    }
    iVar1 = (*local_20->_vptr_Fl_Type[0x20])();
    if ((iVar1 != 0) && (i != (Fl_Type *)0x0)) {
      iVar1 = (*local_20->_vptr_Fl_Type[5])();
      iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"Fl_Tabs");
      if (iVar1 == 0) {
LAB_001a9860:
        Fl_Tabs::value((Fl_Tabs *)local_20[1].prev,(Fl_Widget *)i[1].prev);
        return;
      }
      iVar1 = (*local_20->_vptr_Fl_Type[5])();
      iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"Fl_Wizard");
      if (iVar1 == 0) goto LAB_001a9860;
    }
    iVar1 = (*local_20->_vptr_Fl_Type[0x20])();
    if ((iVar1 != 0) && (iVar1 = (*s->_vptr_Fl_Type[0x17])(), iVar1 != 0)) {
      i = local_20;
    }
    local_20 = local_20->parent;
  } while( true );
}

Assistant:

void check_redraw_corresponding_parent(Fl_Type *s) {
    Fl_Widget_Type * prev_parent = 0;
    if( !s || !s->selected || !s->is_widget()) return;
    for (Fl_Type *i=s; i && i->parent; i=i->parent) {
	if (i->is_group() && prev_parent && 
	    (!strcmp(i->type_name(), "Fl_Tabs") || 
	     !strcmp(i->type_name(), "Fl_Wizard"))) {
	     ((Fl_Tabs*)((Fl_Widget_Type*)i)->o)->value(prev_parent->o);
	     return;
	}
	if (i->is_group() && s->is_widget()) 
	    prev_parent = (Fl_Widget_Type*)i;
    }
}